

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Name __thiscall wasm::Literal::getFunc(Literal *this)

{
  bool bVar1;
  byte local_21;
  Literal *this_local;
  
  bVar1 = Type::isFunction(&this->type);
  local_21 = 0;
  if (bVar1) {
    bVar1 = IString::isNull((IString *)this);
    local_21 = bVar1 ^ 0xff;
  }
  if ((local_21 & 1) != 0) {
    return (IString)(IString)(this->field_0).func.super_IString.str;
  }
  __assert_fail("type.isFunction() && !func.isNull()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x136,"Name wasm::Literal::getFunc() const");
}

Assistant:

Name getFunc() const {
    assert(type.isFunction() && !func.isNull());
    return func;
  }